

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O0

Cluster * __thiscall
AddressMap<std::pair<int,_unsigned_long>_>::FindCluster
          (AddressMap<std::pair<int,_unsigned_long>_> *this,Number address,bool create)

{
  int iVar1;
  ulong x;
  Cluster *c_1;
  Cluster *c;
  int h;
  Number cluster_id;
  bool create_local;
  Number address_local;
  AddressMap<std::pair<int,_unsigned_long>_> *this_local;
  
  x = address >> 0x14;
  iVar1 = HashInt(x);
  c_1 = this->hashtable_[iVar1];
  while( true ) {
    if (c_1 == (Cluster *)0x0) {
      if (create) {
        this_local = (AddressMap<std::pair<int,_unsigned_long>_> *)
                     AddressMap<std::pair<int,unsigned_long>>::
                     New<AddressMap<std::pair<int,unsigned_long>>::Cluster>
                               ((AddressMap<std::pair<int,unsigned_long>> *)this,1);
        ((Cluster *)this_local)->id = x;
        ((Cluster *)this_local)->next = this->hashtable_[iVar1];
        this->hashtable_[iVar1] = (Cluster *)this_local;
      }
      else {
        this_local = (AddressMap<std::pair<int,_unsigned_long>_> *)0x0;
      }
      return (Cluster *)this_local;
    }
    if (c_1->id == x) break;
    c_1 = c_1->next;
  }
  return c_1;
}

Assistant:

Cluster* FindCluster(Number address, bool create) {
    // Look in hashtable
    const Number cluster_id = address >> (kBlockBits + kClusterBits);
    const int h = HashInt(cluster_id);
    for (Cluster* c = hashtable_[h]; c != nullptr; c = c->next) {
      if (c->id == cluster_id) {
        return c;
      }
    }

    // Create cluster if necessary
    if (create) {
      Cluster* c = New<Cluster>(1);
      c->id = cluster_id;
      c->next = hashtable_[h];
      hashtable_[h] = c;
      return c;
    }
    return nullptr;
  }